

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

bool SaveDeviceMemory(path *fname,size_t start,size_t length)

{
  byte *pbVar1;
  pointer pcVar2;
  FILE *__stream;
  size_t sVar3;
  FILE *__s;
  long *local_48 [2];
  long local_38 [2];
  
  __stream = (FILE *)SJ_fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    pcVar2 = (fname->_M_pathname)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,pcVar2,pcVar2 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",(char *)local_48[0],FATAL);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    pbVar1 = Device->Memory;
    __s = (FILE *)0x0;
  }
  else {
    pbVar1 = Device->Memory;
    __s = __stream;
  }
  sVar3 = fwrite(pbVar1 + start,1,length,__s);
  fclose(__stream);
  return sVar3 == length;
}

Assistant:

bool SaveDeviceMemory(const std::filesystem::path & fname, const size_t start, const size_t length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	bool res = SaveDeviceMemory(ff, start, length);
	fclose(ff);
	return res;
}